

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O2

descriptor_state *
asio::detail::object_pool_access::create<asio::detail::epoll_reactor::descriptor_state,bool>
          (bool arg)

{
  descriptor_state *this;
  
  this = (descriptor_state *)operator_new(0xa8);
  epoll_reactor::descriptor_state::descriptor_state(this,arg);
  return this;
}

Assistant:

static Object* create(Arg arg)
  {
    return new Object(arg);
  }